

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

void polyscope::terminatingError(string *message)

{
  ostream *poVar1;
  int __how;
  _Bind<void_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool))(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool)>
  *in_RDI;
  type func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_bool
  *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffef;
  function<void_()> *in_stack_fffffffffffffff0;
  
  if (0 < options::verbosity) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)options::printPrefix_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"[ERROR] ");
    poVar1 = std::operator<<(poVar1,(string *)in_RDI);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::bind<void(&)(std::__cxx11::string,bool),std::__cxx11::string&,bool>
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,(bool *)in_RDI);
  std::function<void()>::
  function<std::_Bind<void(*(std::__cxx11::string,bool))(std::__cxx11::string,bool)>&,void>
            ((function<void_()> *)in_stack_ffffffffffffff90,in_RDI);
  __how = 0;
  pushContext(in_stack_fffffffffffffff0,(bool)in_stack_ffffffffffffffef);
  std::function<void_()>::~function((function<void_()> *)0x35fddc);
  shutdown(-1,__how);
  std::
  _Bind<void_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool))(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool)>
  ::~_Bind((_Bind<void_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool))(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool)>
            *)0x35fdf2);
  return;
}

Assistant:

void terminatingError(std::string message) {
  if (options::verbosity > 0) {
    std::cout << options::printPrefix << "[ERROR] " << message << std::endl;
  }

  auto func = std::bind(buildErrorUI, message, true);
  pushContext(func, false);

  // Quit the program
  shutdown(-1);
}